

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int make_streamsInfo(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
                    int num_coder,coder *coders,int substrm,uint32_t header_crc)

{
  void *pvVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  undefined4 in_register_00000084;
  uint uVar8;
  long lVar9;
  int iVar10;
  long *plVar11;
  uint8_t codec_buff [8];
  int local_44;
  uint8_t crc [4];
  
  local_44 = (int)coders;
  piVar2 = (int *)CONCAT44(in_register_00000084,num_coder);
  pvVar1 = a->format_data;
  if (*(int *)CONCAT44(in_register_00000084,num_coder) == 0) {
    iVar6 = *(int *)((long)pvVar1 + 0x20);
  }
  else {
    iVar6 = 1;
  }
  uVar3 = enc_uint64(a,6);
  if ((-1 < (int)uVar3) && (uVar3 = enc_uint64(a,offset), -1 < (int)uVar3)) {
    uVar3 = enc_uint64(a,(long)iVar6);
    if ((-1 < (int)uVar3) && (uVar3 = enc_uint64(a,9), -1 < (int)uVar3)) {
      if (iVar6 < 2) {
        uVar3 = enc_uint64(a,pack_size);
        if (-1 < (int)uVar3) {
LAB_004e0580:
          uVar3 = enc_uint64(a,0);
          if ((-1 < (int)uVar3) &&
             (((uVar3 = enc_uint64(a,7), -1 < (int)uVar3 &&
               (uVar3 = enc_uint64(a,0xb), -1 < (int)uVar3)) &&
              (uVar3 = enc_uint64(a,(long)iVar6), -1 < (int)uVar3)))) {
            iVar10 = 0;
            uVar3 = enc_uint64(a,0);
            if (-1 < (int)uVar3) {
              iVar4 = 0;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              for (; iVar10 != iVar4; iVar10 = iVar10 + 1) {
                iVar5 = enc_uint64(a,1);
                if (iVar5 < 0) {
                  return iVar5;
                }
                iVar5 = *piVar2;
                codec_buff[0] = '\0';
                codec_buff[1] = '\0';
                codec_buff[2] = '\0';
                codec_buff[3] = '\0';
                codec_buff[4] = (uint8_t)((uint)iVar5 >> 0x18);
                codec_buff[5] = (uint8_t)((uint)iVar5 >> 0x10);
                codec_buff[6] = (uint8_t)((uint)iVar5 >> 8);
                codec_buff[7] = (uint8_t)iVar5;
                for (lVar9 = -8; lVar9 != 0; lVar9 = lVar9 + 1) {
                  if (crc[lVar9 + -4] != '\0') {
                    iVar5 = -(int)lVar9;
                    goto LAB_004e064e;
                  }
                }
                iVar5 = 0;
LAB_004e064e:
                uVar8 = iVar5 + (uint)(iVar5 == 0);
                uVar3 = uVar8 | 0x20;
                if (*(long *)(piVar2 + 2) == 0) {
                  uVar3 = uVar8;
                }
                iVar5 = enc_uint64(a,(long)(int)uVar3);
                if (iVar5 < 0) {
                  return iVar5;
                }
                sVar7 = compress_out(a,codec_buff + (int)(8 - (uVar8 & 0xf)),(ulong)(uVar8 & 0xf),
                                     ARCHIVE_Z_RUN);
                if ((int)sVar7 < 0) {
                  return (int)sVar7;
                }
                if (*(uint64_t *)(piVar2 + 2) != 0) {
                  iVar5 = enc_uint64(a,*(uint64_t *)(piVar2 + 2));
                  if (iVar5 < 0) {
                    return iVar5;
                  }
                  sVar7 = compress_out(a,*(void **)(piVar2 + 4),*(size_t *)(piVar2 + 2),
                                       ARCHIVE_Z_RUN);
                  if ((int)sVar7 < 0) {
                    return (int)sVar7;
                  }
                }
              }
              uVar3 = enc_uint64(a,0xc);
              if (-1 < (int)uVar3) {
                if (iVar6 < 2) {
                  uVar3 = enc_uint64(a,unpack_size);
                  if (-1 < (int)uVar3) {
LAB_004e073a:
                    if (local_44 == 0) {
                      iVar6 = enc_uint64(a,10);
                      if (iVar6 < 0) {
                        return iVar6;
                      }
                      iVar6 = enc_uint64(a,1);
                      if (iVar6 < 0) {
                        return iVar6;
                      }
                      crc = (uint8_t  [4])substrm;
                      sVar7 = compress_out(a,crc,4,ARCHIVE_Z_RUN);
                      if ((int)sVar7 < 0) {
                        return (int)sVar7;
                      }
                    }
                    uVar3 = enc_uint64(a,0);
                    if (-1 < (int)uVar3) {
                      if (local_44 != 0) {
                        pvVar1 = a->format_data;
                        iVar6 = enc_uint64(a,8);
                        if (iVar6 < 0) {
                          return iVar6;
                        }
                        if ((1 < *(ulong *)((long)pvVar1 + 0x20)) && (*piVar2 != 0)) {
                          iVar6 = enc_uint64(a,0xd);
                          if (iVar6 < 0) {
                            return iVar6;
                          }
                          iVar6 = enc_uint64(a,*(uint64_t *)((long)pvVar1 + 0x20));
                          if (iVar6 < 0) {
                            return iVar6;
                          }
                          iVar6 = enc_uint64(a,9);
                          if (iVar6 < 0) {
                            return iVar6;
                          }
                          plVar11 = (long *)((long)pvVar1 + 0xf110);
                          while (((lVar9 = *plVar11, lVar9 != 0 && (*(long *)(lVar9 + 0x18) != 0))
                                 && (*(long *)(*(long *)(lVar9 + 0x18) + 0x30) != 0))) {
                            plVar11 = (long *)(lVar9 + 0x18);
                            iVar6 = enc_uint64(a,*(uint64_t *)(lVar9 + 0x30));
                            if (iVar6 < 0) {
                              return iVar6;
                            }
                          }
                        }
                        iVar6 = enc_uint64(a,10);
                        if (iVar6 < 0) {
                          return iVar6;
                        }
                        iVar6 = enc_uint64(a,1);
                        if (iVar6 < 0) {
                          return iVar6;
                        }
                        plVar11 = (long *)((long)pvVar1 + 0xf110);
                        while ((lVar9 = *plVar11, lVar9 != 0 && (*(long *)(lVar9 + 0x30) != 0))) {
                          crc = *(uint8_t (*) [4])(lVar9 + 0x74);
                          sVar7 = compress_out(a,crc,4,ARCHIVE_Z_RUN);
                          if ((int)sVar7 < 0) {
                            return (int)sVar7;
                          }
                          plVar11 = (long *)(lVar9 + 0x18);
                        }
                        iVar6 = enc_uint64(a,0);
                        if (iVar6 < 0) {
                          return iVar6;
                        }
                      }
                      uVar3 = enc_uint64(a,0);
                      uVar3 = (int)uVar3 >> 0x1f & uVar3;
                    }
                  }
                }
                else {
                  plVar11 = (long *)((long)pvVar1 + 0xf110);
                  do {
                    lVar9 = *plVar11;
                    if ((lVar9 == 0) || (*(uint64_t *)(lVar9 + 0x30) == 0)) goto LAB_004e073a;
                    uVar3 = enc_uint64(a,*(uint64_t *)(lVar9 + 0x30));
                    plVar11 = (long *)(lVar9 + 0x18);
                  } while (-1 < (int)uVar3);
                }
              }
            }
          }
        }
      }
      else {
        plVar11 = (long *)((long)pvVar1 + 0xf110);
        do {
          lVar9 = *plVar11;
          if ((lVar9 == 0) || (*(uint64_t *)(lVar9 + 0x30) == 0)) goto LAB_004e0580;
          uVar3 = enc_uint64(a,*(uint64_t *)(lVar9 + 0x30));
          plVar11 = (long *)(lVar9 + 0x18);
        } while (-1 < (int)uVar3);
      }
    }
  }
  return uVar3;
}

Assistant:

static int
make_streamsInfo(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int num_coder, struct coder *coders, int substrm,
    uint32_t header_crc)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	uint8_t codec_buff[8];
	int numFolders, fi;
	int codec_size;
	int i, r;

	if (coders->codec == _7Z_COPY)
		numFolders = (int)zip->total_number_nonempty_entry;
	else
		numFolders = 1;

	/*
	 * Make PackInfo.
	 */
	r = enc_uint64(a, kPackInfo);
	if (r < 0)
		return (r);

	/* Write PackPos. */
	r = enc_uint64(a, offset);
	if (r < 0)
		return (r);

	/* Write NumPackStreams. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Make Size. */
	r = enc_uint64(a, kSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	} else {
		/* Write size. */
		r = enc_uint64(a, pack_size);
		if (r < 0)
			return (r);
	}

	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/*
	 * Make UnPackInfo.
	 */
	r = enc_uint64(a, kUnPackInfo);
	if (r < 0)
		return (r);

	/*
	 * Make Folder.
	 */
	r = enc_uint64(a, kFolder);
	if (r < 0)
		return (r);

	/* Write NumFolders. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Write External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	for (fi = 0; fi < numFolders; fi++) {
		/* Write NumCoders. */
		r = enc_uint64(a, num_coder);
		if (r < 0)
			return (r);

		for (i = 0; i < num_coder; i++) {
			unsigned codec_id = coders[i].codec;

			/* Write Codec flag. */
			archive_be64enc(codec_buff, codec_id);
			for (codec_size = 8; codec_size > 0; codec_size--) {
				if (codec_buff[8 - codec_size])
					break;
			}
			if (codec_size == 0)
				codec_size = 1;
			if (coders[i].prop_size)
				r = enc_uint64(a, codec_size | 0x20);
			else
				r = enc_uint64(a, codec_size);
			if (r < 0)
				return (r);

			/* Write Codec ID. */
			codec_size &= 0x0f;
			r = (int)compress_out(a, &codec_buff[8-codec_size],
				codec_size, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);

			if (coders[i].prop_size) {
				/* Write Codec property size. */
				r = enc_uint64(a, coders[i].prop_size);
				if (r < 0)
					return (r);

				/* Write Codec properties. */
				r = (int)compress_out(a, coders[i].props,
					coders[i].prop_size, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
			}
		}
	}

	/*
	 * Make CodersUnPackSize.
	 */
	r = enc_uint64(a, kCodersUnPackSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}

	} else {
		/* Write UnPackSize. */
		r = enc_uint64(a, unpack_size);
		if (r < 0)
			return (r);
	}

	if (!substrm) {
		uint8_t crc[4];
		/*
		 * Make CRC.
		 */
		r = enc_uint64(a, kCRC);
		if (r < 0)
			return (r);

		/* All are defined */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
		archive_le32enc(crc, header_crc);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	if (substrm) {
		/*
		 * Make SubStreamsInfo.
		 */
		r = make_substreamsInfo(a, coders);
		if (r < 0)
			return (r);
	}


	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}